

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void integer_suite::test_lowest(void)

{
  char cVar1;
  short sVar2;
  int iVar3;
  char value;
  int value_2;
  __string_type input;
  decoder_type decoder;
  ostringstream stream;
  undefined4 local_304;
  ulong local_300;
  undefined8 local_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0 [2];
  basic_decoder<char> local_2d0;
  long local_1a0;
  undefined8 local_198 [13];
  ios_base local_130 [264];
  
  local_304 = CONCAT31(local_304._1_3_,0x80);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0;
  std::ostream::operator<<((ostringstream *)&local_1a0,-0x80);
  std::__cxx11::stringbuf::str();
  local_2d0.input.tail = (const_pointer)((long)local_2f0 + local_2e8);
  local_2d0.input.head = (const_pointer)local_2f0;
  memset(&local_2d0.current,0,0x120);
  local_2d0.current.code = uninitialized;
  local_2d0.current.view.head = (const_pointer)0x0;
  local_2d0.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
  local_2f8 = CONCAT44(local_2f8._4_4_,local_2d0.current.code);
  local_300 = CONCAT44(local_300._4_4_,8);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ba,"void integer_suite::test_lowest()",&local_2f8,&local_300);
  cVar1 = trial::protocol::json::detail::basic_decoder<char>::signed_value<signed_char>(&local_2d0);
  local_2f8 = CONCAT71(local_2f8._1_7_,cVar1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1bb,"void integer_suite::test_lowest()",&local_2f8,&local_304);
  if (error_unexpected_token < local_2d0.current.code) {
    if (local_2d0.current.code == end) {
      local_2d0.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
    }
  }
  local_2f8 = CONCAT44(local_2f8._4_4_,local_2d0.current.code);
  local_300 = local_300 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1bd,"void integer_suite::test_lowest()",&local_2f8,&local_300);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  local_304 = CONCAT22(local_304._2_2_,0x8000);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0;
  std::ostream::operator<<((ostringstream *)&local_1a0,(short)local_304);
  std::__cxx11::stringbuf::str();
  local_2d0.input.tail = (const_pointer)((long)local_2f0 + local_2e8);
  local_2d0.input.head = (const_pointer)local_2f0;
  memset(&local_2d0.current,0,0x120);
  local_2d0.current.code = uninitialized;
  local_2d0.current.view.head = (const_pointer)0x0;
  local_2d0.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
  local_2f8 = CONCAT44(local_2f8._4_4_,local_2d0.current.code);
  local_300 = CONCAT44(local_300._4_4_,8);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1c7,"void integer_suite::test_lowest()",&local_2f8,&local_300);
  sVar2 = trial::protocol::json::detail::basic_decoder<char>::signed_value<short>(&local_2d0);
  local_2f8 = CONCAT62(local_2f8._2_6_,sVar2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1c8,"void integer_suite::test_lowest()",&local_2f8,&local_304);
  if (error_unexpected_token < local_2d0.current.code) {
    if (local_2d0.current.code == end) {
      local_2d0.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
    }
  }
  local_2f8 = CONCAT44(local_2f8._4_4_,local_2d0.current.code);
  local_300 = local_300 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ca,"void integer_suite::test_lowest()",&local_2f8,&local_300);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  local_2f8 = CONCAT44(local_2f8._4_4_,0x80000000);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0;
  std::ostream::operator<<((ostringstream *)&local_1a0,(int)local_2f8);
  std::__cxx11::stringbuf::str();
  local_2d0.input.tail = (const_pointer)((long)local_2f0 + local_2e8);
  local_2d0.input.head = (const_pointer)local_2f0;
  memset(&local_2d0.current,0,0x120);
  local_2d0.current.code = uninitialized;
  local_2d0.current.view.head = (const_pointer)0x0;
  local_2d0.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
  local_300._0_4_ = local_2d0.current.code;
  local_304 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d4,"void integer_suite::test_lowest()",&local_300,&local_304);
  iVar3 = trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&local_2d0);
  local_300 = CONCAT44(local_300._4_4_,iVar3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d5,"void integer_suite::test_lowest()",&local_300,&local_2f8);
  if (error_unexpected_token < local_2d0.current.code) {
    if (local_2d0.current.code == end) {
      local_2d0.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
    }
  }
  local_300 = CONCAT44(local_300._4_4_,local_2d0.current.code);
  local_304 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d7,"void integer_suite::test_lowest()",&local_300,&local_304);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  local_2f8 = 0x8000000000000000;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0;
  std::ostream::_M_insert<long>((long)&local_1a0);
  std::__cxx11::stringbuf::str();
  local_2d0.input.tail = (const_pointer)((long)local_2f0 + local_2e8);
  local_2d0.input.head = (const_pointer)local_2f0;
  memset(&local_2d0.current,0,0x120);
  local_2d0.current.code = uninitialized;
  local_2d0.current.view.head = (const_pointer)0x0;
  local_2d0.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
  local_300 = CONCAT44(local_300._4_4_,local_2d0.current.code);
  local_304 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e1,"void integer_suite::test_lowest()",&local_300,&local_304);
  local_300 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&local_2d0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e2,"void integer_suite::test_lowest()",&local_300,&local_2f8);
  if (error_unexpected_token < local_2d0.current.code) {
    if (local_2d0.current.code == end) {
      local_2d0.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
    }
  }
  local_300 = CONCAT44(local_300._4_4_,local_2d0.current.code);
  local_304 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e4,"void integer_suite::test_lowest()",&local_300,&local_304);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  local_2f8 = 0x8000000000000000;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0;
  std::ostream::_M_insert<long_long>((longlong)&local_1a0);
  std::__cxx11::stringbuf::str();
  local_2d0.input.tail = (const_pointer)((long)local_2f0 + local_2e8);
  local_2d0.input.head = (const_pointer)local_2f0;
  memset(&local_2d0.current,0,0x120);
  local_2d0.current.code = uninitialized;
  local_2d0.current.view.head = (const_pointer)0x0;
  local_2d0.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
  local_300 = CONCAT44(local_300._4_4_,local_2d0.current.code);
  local_304 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ee,"void integer_suite::test_lowest()",&local_300,&local_304);
  local_300 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long_long>
                        (&local_2d0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ef,"void integer_suite::test_lowest()",&local_300,&local_2f8);
  if (error_unexpected_token < local_2d0.current.code) {
    if (local_2d0.current.code == end) {
      local_2d0.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_2d0);
    }
  }
  local_300 = CONCAT44(local_300._4_4_,local_2d0.current.code);
  local_304 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1f1,"void integer_suite::test_lowest()",&local_300,&local_304);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void test_lowest()
{
    {
        using integer_type = signed char;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << signed(value);
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed short int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed long int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed long long int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
}